

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_ManFree(Dtt_Man_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  long lVar4;
  
  pVVar2 = p->vVisited;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vVisited->pArray = (int *)0x0;
      pVVar2 = p->vVisited;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00524849;
    }
    free(pVVar2);
    p->vVisited = (Vec_Int_t *)0x0;
  }
LAB_00524849:
  if (p->pTable != (uint *)0x0) {
    free(p->pTable);
    p->pTable = (uint *)0x0;
  }
  if (p->pNodes != (int *)0x0) {
    free(p->pNodes);
    p->pNodes = (int *)0x0;
  }
  if (p->pTimes != (int *)0x0) {
    free(p->pTimes);
    p->pTimes = (int *)0x0;
  }
  if (p->pVisited != (char *)0x0) {
    free(p->pVisited);
    p->pVisited = (char *)0x0;
  }
  pVVar2 = p->vFanins;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vFanins->pArray = (int *)0x0;
      pVVar2 = p->vFanins;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_005248f5;
    }
    free(pVVar2);
    p->vFanins = (Vec_Int_t *)0x0;
  }
LAB_005248f5:
  pVVar2 = p->vTruths;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vTruths->pArray = (int *)0x0;
      pVVar2 = p->vTruths;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00524931;
    }
    free(pVVar2);
    p->vTruths = (Vec_Int_t *)0x0;
  }
LAB_00524931:
  pVVar2 = p->vConfigs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vConfigs->pArray = (int *)0x0;
      pVVar2 = p->vConfigs;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0052496d;
    }
    free(pVVar2);
    p->vConfigs = (Vec_Int_t *)0x0;
  }
LAB_0052496d:
  pVVar2 = p->vClasses;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vClasses->pArray = (int *)0x0;
      pVVar2 = p->vClasses;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_005249a9;
    }
    free(pVVar2);
    p->vClasses = (Vec_Int_t *)0x0;
  }
LAB_005249a9:
  pVVar2 = p->vTruthNpns;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vTruthNpns->pArray = (int *)0x0;
      pVVar2 = p->vTruthNpns;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_005249e5;
    }
    free(pVVar2);
    p->vTruthNpns = (Vec_Int_t *)0x0;
  }
LAB_005249e5:
  __ptr = p->vFunNodes;
  if (__ptr != (Vec_Wec_t *)0x0) {
    iVar1 = __ptr->nCap;
    pVVar2 = __ptr->pArray;
    if (iVar1 < 1) {
      if (pVVar2 != (Vec_Int_t *)0x0) goto LAB_00524a38;
    }
    else {
      lVar4 = 8;
      lVar3 = 0;
      do {
        __ptr_00 = *(void **)((long)&pVVar2->nCap + lVar4);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          pVVar2 = __ptr->pArray;
          *(undefined8 *)((long)&pVVar2->nCap + lVar4) = 0;
          iVar1 = __ptr->nCap;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < iVar1);
LAB_00524a38:
      free(pVVar2);
    }
    free(__ptr);
    p->vFunNodes = (Vec_Wec_t *)0x0;
  }
  pVVar2 = p->vTemp;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vTemp->pArray = (int *)0x0;
      pVVar2 = p->vTemp;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00524a89;
    }
    free(pVVar2);
    p->vTemp = (Vec_Int_t *)0x0;
  }
LAB_00524a89:
  pVVar2 = p->vTemp2;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vTemp2->pArray = (int *)0x0;
      pVVar2 = p->vTemp2;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00524ac5;
    }
    free(pVVar2);
    p->vTemp2 = (Vec_Int_t *)0x0;
  }
LAB_00524ac5:
  pVVar2 = p->vUsedBins;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vUsedBins->pArray = (int *)0x0;
      pVVar2 = p->vUsedBins;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00524b0d;
    }
    free(pVVar2);
    p->vUsedBins = (Vec_Int_t *)0x0;
  }
LAB_00524b0d:
  if (p->pPerms != (int *)0x0) {
    free(p->pPerms);
    p->pPerms = (int *)0x0;
  }
  if (p->pComps != (int *)0x0) {
    free(p->pComps);
    p->pComps = (int *)0x0;
  }
  if (p->pPres != (word *)0x0) {
    free(p->pPres);
    p->pPres = (word *)0x0;
  }
  if (p->pBins != (uint *)0x0) {
    free(p->pBins);
  }
  free(p);
  return;
}

Assistant:

void Dtt_ManFree( Dtt_Man_t * p )
{
    Vec_IntFreeP( &p->vVisited );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pNodes );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pVisited );
    Vec_IntFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vConfigs );
    Vec_IntFreeP( &p->vClasses );
    Vec_IntFreeP( &p->vTruthNpns );
    Vec_WecFreeP( &p->vFunNodes );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vTemp2 );
    Vec_IntFreeP( &p->vUsedBins );
    ABC_FREE( p->pPerms );
    ABC_FREE( p->pComps );
    ABC_FREE( p->pPres );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}